

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  string *psVar3;
  undefined1 *puVar4;
  long lVar5;
  string example_struct;
  string shader_source;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "struct light {\n    float[2] intensity;\n    int[2] position;\n};\n","");
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  lVar5 = 1;
  do {
    std::__cxx11::string::_M_assign((string *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,shader_start_abi_cxx11_);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"    light my_light_object","");
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"[2]","");
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_90,this,local_d0,(string *)local_b0,lVar5);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    std::__cxx11::string::append((char *)&local_50);
    puVar1 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_50);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar1 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_50,*puVar1);
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x594);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_50,shader_end_abi_cxx11_);
    puVar4 = empty_string_abi_cxx11_;
    psVar3 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar4 = default_vertex_shader_source_abi_cxx11_;
      psVar3 = (string *)&local_50;
      break;
    case VERTEX_SHADER_TYPE:
      puVar4 = (string *)&local_50;
      goto LAB_00b33efa;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
    case TESSELATION_CONTROL_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar4 = default_vertex_shader_source_abi_cxx11_;
LAB_00b33efa:
      psVar3 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x597);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[9])(this,puVar4,psVar3,1,0);
    lVar5 = lVar5 + 1;
    if (lVar5 == 9) {
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void SizedDeclarationsStructTypes3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float[2] intensity;\n"
							   "    int[2] position;\n"
							   "};\n");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;
		shader_source += shader_start;
		shader_source += this->extend_string("    light my_light_object", "[2]", max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}